

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darPrec.c
# Opt level: O2

void Dar_Truth4VarNPN(unsigned_short **puCanons,char **puPhases,char **puPerms,uchar **puMap)

{
  uchar *puVar1;
  uchar uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  unsigned_short *__ptr;
  char *__ptr_00;
  char *__ptr_01;
  uchar *__ptr_02;
  char **__ptr_03;
  ulong uVar7;
  int Polarity;
  long lVar8;
  uint uVar9;
  unsigned_short uVar10;
  ulong uVar11;
  
  __ptr = (unsigned_short *)calloc(0x10000,2);
  __ptr_00 = (char *)calloc(0x10000,1);
  __ptr_01 = (char *)calloc(0x10000,1);
  __ptr_02 = (uchar *)calloc(0x10000,1);
  __ptr_03 = Dar_Permutations(4);
  uVar9 = 1;
  for (uVar11 = 1; uVar11 != 0x8000; uVar11 = uVar11 + 1) {
    uVar7 = (ulong)__ptr[uVar11];
    if (uVar7 == 0) {
      uVar4 = uVar9 + 1;
      __ptr_02[uVar11] = (uchar)uVar9;
      for (Polarity = 0; Polarity != 0x10; Polarity = Polarity + 1) {
        uVar5 = Dar_TruthPolarize((uint)uVar11,Polarity,4);
        bVar3 = (byte)Polarity;
        for (lVar8 = 0; uVar10 = (unsigned_short)uVar11, lVar8 != 0x18; lVar8 = lVar8 + 1) {
          uVar6 = Dar_TruthPermute(uVar5,__ptr_03[lVar8],4,0);
          if ((ulong)__ptr[uVar6] == 0) {
            __ptr[uVar6] = uVar10;
            __ptr_00[uVar6] = bVar3;
            __ptr_01[uVar6] = (char)lVar8;
            __ptr_02[uVar6] = (uchar)uVar9;
            uVar7 = (ulong)(ushort)uVar6 ^ 0xffff;
            __ptr[uVar7] = uVar10;
            __ptr_00[uVar7] = bVar3 | 0x10;
            __ptr_01[uVar7] = (char)lVar8;
            uVar9 = (uint)__ptr_02[uVar11];
            __ptr_02[uVar7] = __ptr_02[uVar11];
          }
          else if (uVar11 != __ptr[uVar6]) {
            __assert_fail("uCanons[uPerm] == uTruth",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darPrec.c"
                          ,0x155,
                          "void Dar_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                         );
          }
        }
        uVar5 = Dar_TruthPolarize((uint)uVar11 ^ 0xffff,Polarity,4);
        for (lVar8 = 0; lVar8 != 0x18; lVar8 = lVar8 + 1) {
          uVar6 = Dar_TruthPermute(uVar5,__ptr_03[lVar8],4,0);
          if ((ulong)__ptr[uVar6] == 0) {
            __ptr[uVar6] = uVar10;
            __ptr_00[uVar6] = bVar3;
            __ptr_01[uVar6] = (char)lVar8;
            __ptr_02[uVar6] = (uchar)uVar9;
            uVar7 = (ulong)(ushort)uVar6 ^ 0xffff;
            __ptr[uVar7] = uVar10;
            __ptr_00[uVar7] = bVar3 | 0x10;
            __ptr_01[uVar7] = (char)lVar8;
            uVar9 = (uint)__ptr_02[uVar11];
            __ptr_02[uVar7] = __ptr_02[uVar11];
          }
          else if (uVar11 != __ptr[uVar6]) {
            __assert_fail("uCanons[uPerm] == uTruth",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darPrec.c"
                          ,0x169,
                          "void Dar_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                         );
          }
        }
      }
    }
    else {
      if (uVar11 <= uVar7) {
        __assert_fail("uTruth > uCanons[uTruth]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darPrec.c"
                      ,0x13c,
                      "void Dar_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                     );
      }
      uVar2 = __ptr_02[uVar7];
      __ptr_02[uVar11] = uVar2;
      __ptr_02[uVar11 & 0xffffffff ^ 0xffff] = uVar2;
      uVar4 = uVar9;
    }
    uVar9 = uVar4;
  }
  lVar8 = 1;
  while (lVar8 != 0xffff) {
    puVar1 = __ptr_02 + lVar8;
    lVar8 = lVar8 + 1;
    if (*puVar1 == '\0') {
      __assert_fail("uMap[uTruth] != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darPrec.c"
                    ,0x16e,
                    "void Dar_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)");
    }
  }
  __ptr_00[0xffff] = '\x10';
  if (uVar9 == 0xde) {
    free(__ptr_03);
    if (puCanons == (unsigned_short **)0x0) {
      free(__ptr);
    }
    else {
      *puCanons = __ptr;
    }
    if (puPhases == (char **)0x0) {
      free(__ptr_00);
    }
    else {
      *puPhases = __ptr_00;
    }
    if (puPerms == (char **)0x0) {
      free(__ptr_01);
    }
    else {
      *puPerms = __ptr_01;
    }
    if (puMap == (uchar **)0x0) {
      free(__ptr_02);
      return;
    }
    *puMap = __ptr_02;
    return;
  }
  __assert_fail("nClasses == 222",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darPrec.c"
                ,0x170,
                "void Dar_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)");
}

Assistant:

void Dar_Truth4VarNPN( unsigned short ** puCanons, char ** puPhases, char ** puPerms, unsigned char ** puMap )
{
    unsigned short * uCanons;
    unsigned char * uMap;
    unsigned uTruth, uPhase, uPerm;
    char ** pPerms4, * uPhases, * uPerms;
    int nFuncs, nClasses;
    int i, k;

    nFuncs  = (1 << 16);
    uCanons = ABC_CALLOC( unsigned short, nFuncs );
    uPhases = ABC_CALLOC( char, nFuncs );
    uPerms  = ABC_CALLOC( char, nFuncs );
    uMap    = ABC_CALLOC( unsigned char, nFuncs );
    pPerms4 = Dar_Permutations( 4 );

    nClasses = 1;
    nFuncs = (1 << 15);
    for ( uTruth = 1; uTruth < (unsigned)nFuncs; uTruth++ )
    {
        // skip already assigned
        if ( uCanons[uTruth] )
        {
            assert( uTruth > uCanons[uTruth] );
            uMap[~uTruth & 0xFFFF] = uMap[uTruth] = uMap[uCanons[uTruth]];
            continue;
        }
        uMap[uTruth] = nClasses++;
        for ( i = 0; i < 16; i++ )
        {
            uPhase = Dar_TruthPolarize( uTruth, i, 4 );
            for ( k = 0; k < 24; k++ )
            {
                uPerm = Dar_TruthPermute( uPhase, pPerms4[k], 4, 0 );
                if ( uCanons[uPerm] == 0 )
                {
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i;
                    uPerms[uPerm]  = k;
                    uMap[uPerm]    = uMap[uTruth];

                    uPerm = ~uPerm & 0xFFFF;
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i | 16;
                    uPerms[uPerm]  = k;
                    uMap[uPerm]    = uMap[uTruth];
                }
                else
                    assert( uCanons[uPerm] == uTruth );
            }
            uPhase = Dar_TruthPolarize( ~uTruth & 0xFFFF, i, 4 ); 
            for ( k = 0; k < 24; k++ )
            {
                uPerm = Dar_TruthPermute( uPhase, pPerms4[k], 4, 0 );
                if ( uCanons[uPerm] == 0 )
                {
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i;
                    uPerms[uPerm]  = k;
                    uMap[uPerm]    = uMap[uTruth];

                    uPerm = ~uPerm & 0xFFFF;
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i | 16;
                    uPerms[uPerm]  = k;
                    uMap[uPerm]    = uMap[uTruth];
                }
                else
                    assert( uCanons[uPerm] == uTruth );
            }
        }
    }
    for ( uTruth = 1; uTruth < 0xffff; uTruth++ )
        assert( uMap[uTruth] != 0 );
    uPhases[(1<<16)-1] = 16;
    assert( nClasses == 222 );
    ABC_FREE( pPerms4 );
    if ( puCanons ) 
        *puCanons = uCanons;
    else
        ABC_FREE( uCanons );
    if ( puPhases ) 
        *puPhases = uPhases;
    else
        ABC_FREE( uPhases );
    if ( puPerms ) 
        *puPerms = uPerms;
    else
        ABC_FREE( uPerms );
    if ( puMap ) 
        *puMap = uMap;
    else
        ABC_FREE( uMap );
}